

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sorter.cpp
# Opt level: O2

void __thiscall
duckdb::MergeSorter::FlushBlobs
          (MergeSorter *this,RowLayout *layout,idx_t *source_count,data_ptr_t *source_data_ptr,
          idx_t *source_entry_idx,data_ptr_t *source_heap_ptr,RowDataBlock *target_data_block,
          data_ptr_t *target_data_ptr,RowDataBlock *target_heap_block,
          BufferHandle *target_heap_handle,data_ptr_t *target_heap_ptr,idx_t *copied,idx_t *count)

{
  uint uVar1;
  idx_t iVar2;
  idx_t iVar3;
  uint *puVar4;
  data_ptr_t pdVar5;
  long lVar6;
  long lVar7;
  idx_t new_capacity;
  ulong uVar8;
  size_t __n;
  bool bVar9;
  idx_t copied_copy;
  data_ptr_t target_data_ptr_copy;
  idx_t source_entry_idx_copy;
  idx_t row_width;
  
  iVar2 = layout->row_width;
  iVar3 = layout->heap_pointer_offset;
  source_entry_idx_copy = *source_entry_idx;
  target_data_ptr_copy = *target_data_ptr;
  copied_copy = *copied;
  row_width = iVar2;
  FlushRows((MergeSorter *)&row_width,source_data_ptr,&source_entry_idx_copy,source_count,
            target_data_block,&target_data_ptr_copy,&row_width,&copied_copy,count);
  lVar6 = copied_copy - *copied;
  puVar4 = (uint *)*source_heap_ptr;
  __n = 0;
  lVar7 = lVar6;
  while( true ) {
    uVar8 = target_heap_block->byte_offset + __n;
    bVar9 = lVar7 == 0;
    lVar7 = lVar7 + -1;
    if (bVar9) break;
    *(ulong *)(*target_data_ptr + iVar3) = uVar8;
    *target_data_ptr = *target_data_ptr + iVar2;
    uVar1 = *puVar4;
    puVar4 = (uint *)((long)puVar4 + (ulong)uVar1);
    __n = __n + uVar1;
  }
  if (target_heap_block->capacity < uVar8) {
    (*this->buffer_manager->_vptr_BufferManager[6])(this->buffer_manager,target_heap_block,uVar8);
    target_heap_block->capacity = uVar8;
    pdVar5 = BufferHandle::Ptr(target_heap_handle);
    pdVar5 = pdVar5 + target_heap_block->byte_offset;
    *target_heap_ptr = pdVar5;
  }
  else {
    pdVar5 = *target_heap_ptr;
  }
  switchD_01939fa4::default(pdVar5,*source_heap_ptr,__n);
  *target_heap_ptr = *target_heap_ptr + __n;
  *source_heap_ptr = *source_heap_ptr + __n;
  *source_entry_idx = *source_entry_idx + lVar6;
  *copied = *copied + lVar6;
  target_heap_block->count = target_heap_block->count + lVar6;
  target_heap_block->byte_offset = target_heap_block->byte_offset + __n;
  return;
}

Assistant:

void MergeSorter::FlushBlobs(const RowLayout &layout, const idx_t &source_count, data_ptr_t &source_data_ptr,
                             idx_t &source_entry_idx, data_ptr_t &source_heap_ptr, RowDataBlock &target_data_block,
                             data_ptr_t &target_data_ptr, RowDataBlock &target_heap_block,
                             BufferHandle &target_heap_handle, data_ptr_t &target_heap_ptr, idx_t &copied,
                             const idx_t &count) {
	const idx_t row_width = layout.GetRowWidth();
	const idx_t heap_pointer_offset = layout.GetHeapOffset();
	idx_t source_entry_idx_copy = source_entry_idx;
	data_ptr_t target_data_ptr_copy = target_data_ptr;
	idx_t copied_copy = copied;
	// Flush row data
	FlushRows(source_data_ptr, source_entry_idx_copy, source_count, target_data_block, target_data_ptr_copy, row_width,
	          copied_copy, count);
	const idx_t flushed = copied_copy - copied;
	// Compute the entry sizes and number of heap bytes that will be copied
	idx_t copy_bytes = 0;
	data_ptr_t source_heap_ptr_copy = source_heap_ptr;
	for (idx_t i = 0; i < flushed; i++) {
		// Store base heap offset in the row data
		Store<idx_t>(target_heap_block.byte_offset + copy_bytes, target_data_ptr + heap_pointer_offset);
		target_data_ptr += row_width;
		// Compute entry size and add to total
		auto entry_size = Load<uint32_t>(source_heap_ptr_copy);
		D_ASSERT(entry_size >= sizeof(uint32_t));
		source_heap_ptr_copy += entry_size;
		copy_bytes += entry_size;
	}
	// Reallocate result heap block size (if needed)
	if (target_heap_block.byte_offset + copy_bytes > target_heap_block.capacity) {
		idx_t new_capacity = target_heap_block.byte_offset + copy_bytes;
		buffer_manager.ReAllocate(target_heap_block.block, new_capacity);
		target_heap_block.capacity = new_capacity;
		target_heap_ptr = target_heap_handle.Ptr() + target_heap_block.byte_offset;
	}
	D_ASSERT(target_heap_block.byte_offset + copy_bytes <= target_heap_block.capacity);
	// Copy the heap data in one go
	memcpy(target_heap_ptr, source_heap_ptr, copy_bytes);
	target_heap_ptr += copy_bytes;
	source_heap_ptr += copy_bytes;
	source_entry_idx += flushed;
	copied += flushed;
	// Update result indices and pointers
	target_heap_block.count += flushed;
	target_heap_block.byte_offset += copy_bytes;
	D_ASSERT(target_heap_block.byte_offset <= target_heap_block.capacity);
}